

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_draw_lbd_circles.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  LBDOperator *this;
  Mat destImage;
  allocator local_d9;
  void *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  long *local_c0 [2];
  long local_b0 [2];
  undefined8 local_a0;
  undefined8 local_98;
  _InputArray local_90;
  Mat local_78 [96];
  
  __s1 = argv[1];
  iVar1 = strncmp(__s1,"freak",5);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = strncmp(__s1,"brief",5);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error. The parameter should be either freak or brief.\n",
                 0x36);
      return -1;
    }
    iVar1 = 2;
  }
  this = lts2::CreateLbdOperator(iVar1,0x100);
  local_98 = 0x2000000020;
  (*(this->super_LinearOperator)._vptr_LinearOperator[5])(this);
  local_a0 = 0x20000000200;
  cv::Mat::Mat(local_78,&local_a0,0x10);
  lts2::LBDOperator::drawSelfAsCircles(this,local_78);
  std::__cxx11::string::string((string *)local_c0,argv[2],&local_d9);
  local_90.sz.width = 0;
  local_90.sz.height = 0;
  local_90.flags = 0x1010000;
  local_c8 = 0;
  local_d8 = (void *)0x0;
  uStack_d0 = 0;
  local_90.obj = local_78;
  cv::imwrite((string *)local_c0,&local_90,(vector *)&local_d8);
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  cv::Mat::~Mat(local_78);
  return 0;
}

Assistant:

int main(int argc, char * const *argv)
{
  int M = 256;
  cv::Size imsize(512, 512);
  cv::Size psize(32,32);

  int lbdType;
  if (strncmp(argv[1], "freak", 5) == 0)
  {
    lbdType = (int)lbd::LBD_TYPE::eTypeFreak;;
  }
  else
  {
    if (strncmp(argv[1], "brief", 5) == 0)
    {
      lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
    }
    else
    {
      std::cerr << "Error. The parameter should be either freak or brief.\n";
      return -1;
    }
  }

  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType, M);
  LBD->initWithPatchSize(psize);

  cv::Mat destImage(cv::Size(imsize), CV_8UC3);
  LBD->drawSelfAsCircles(destImage);
  
  cv::imwrite(argv[2], destImage);

  return EXIT_SUCCESS;
}